

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears_engine.c
# Opt level: O0

int gears_engine_nb(void)

{
  list *local_18;
  list *engine_entry;
  int nb;
  
  engine_entry._4_4_ = 0;
  for (local_18 = engine_list.next; local_18 != &engine_list; local_18 = local_18->next) {
    engine_entry._4_4_ = engine_entry._4_4_ + 1;
  }
  return engine_entry._4_4_;
}

Assistant:

int gears_engine_nb()
{
  int nb = 0;
  struct list *engine_entry = NULL;

  LIST_FOR_EACH(engine_entry, &engine_list) {
    nb++;
  }

  return nb;
}